

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofConstraint::getInfo2(btGeneric6DofConstraint *this,btConstraintInfo2 *info)

{
  btTransform *transA;
  btTransform *transB;
  btVector3 *linVelA;
  btRigidBody *pbVar1;
  btRigidBody *pbVar2;
  int iVar3;
  btVector3 *angVelA;
  btVector3 *linVelB;
  btVector3 *angVelB;
  
  pbVar1 = (this->super_btTypedConstraint).m_rbA;
  pbVar2 = (this->super_btTypedConstraint).m_rbB;
  transA = &(pbVar1->super_btCollisionObject).m_worldTransform;
  transB = &(pbVar2->super_btCollisionObject).m_worldTransform;
  linVelA = &pbVar1->m_linearVelocity;
  linVelB = &pbVar2->m_linearVelocity;
  angVelA = &pbVar1->m_angularVelocity;
  angVelB = &pbVar2->m_angularVelocity;
  if (this->m_useOffsetForConstraintFrame == true) {
    iVar3 = setAngularLimits(this,info,0,transA,transB,linVelA,linVelB,angVelA,angVelB);
    setLinearLimits(this,info,iVar3,transA,transB,linVelA,linVelB,angVelA,angVelB);
  }
  else {
    iVar3 = setLinearLimits(this,info,0,transA,transB,linVelA,linVelB,angVelA,angVelB);
    setAngularLimits(this,info,iVar3,transA,transB,linVelA,linVelB,angVelA,angVelB);
  }
  return;
}

Assistant:

void btGeneric6DofConstraint::getInfo2 (btConstraintInfo2* info)
{
	btAssert(!m_useSolveConstraintObsolete);

	const btTransform& transA = m_rbA.getCenterOfMassTransform();
	const btTransform& transB = m_rbB.getCenterOfMassTransform();
	const btVector3& linVelA = m_rbA.getLinearVelocity();
	const btVector3& linVelB = m_rbB.getLinearVelocity();
	const btVector3& angVelA = m_rbA.getAngularVelocity();
	const btVector3& angVelB = m_rbB.getAngularVelocity();

	if(m_useOffsetForConstraintFrame)
	{ // for stability better to solve angular limits first
		int row = setAngularLimits(info, 0,transA,transB,linVelA,linVelB,angVelA,angVelB);
		setLinearLimits(info, row, transA,transB,linVelA,linVelB,angVelA,angVelB);
	}
	else
	{ // leave old version for compatibility
		int row = setLinearLimits(info, 0, transA,transB,linVelA,linVelB,angVelA,angVelB);
		setAngularLimits(info, row,transA,transB,linVelA,linVelB,angVelA,angVelB);
	}

}